

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynet.h
# Opt level: O3

VariableIndex __thiscall
dynet::ComputationGraph::
add_function<dynet::HingeDim,std::vector<unsigned_int,std::allocator<unsigned_int>>const*&,unsigned_int&,float&>
          (ComputationGraph *this,initializer_list<unsigned_int> *arguments,
          vector<unsigned_int,_std::allocator<unsigned_int>_> **side_information,
          uint *side_information_1,float *side_information_2)

{
  uint uVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar2;
  iterator __position;
  Node *pNVar3;
  pointer ppNVar4;
  Device **ppDVar5;
  VariableIndex new_node_index;
  allocator_type local_41;
  float local_40;
  VariableIndex local_3c;
  Node *local_38;
  
  local_3c = (VariableIndex)
             ((ulong)((long)(this->nodes).
                            super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->nodes).
                           super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl
                           .super__Vector_impl_data._M_start) >> 3);
  pNVar3 = (Node *)operator_new(0xb0);
  pvVar2 = *side_information;
  uVar1 = *side_information_1;
  local_40 = *side_information_2;
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_005b4008;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&pNVar3->args,*arguments,&local_41);
  (pNVar3->dim).nd = 0;
  (pNVar3->dim).bd = 1;
  pNVar3->device = (Device *)0x0;
  pNVar3->_vptr_Node = (_func_int **)&PTR__HingeDim_005b68e8;
  pNVar3[1]._vptr_Node = (_func_int **)0x0;
  pNVar3[1].args.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pNVar3[1].args.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pNVar3[1].args.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pvVar2;
  pNVar3[1].dim.d[0] = 0;
  pNVar3[1].dim.d[1] = 0;
  pNVar3[1].dim.d[2] = 0;
  pNVar3[1].dim.d[3] = 0;
  pNVar3[1].dim.d[4] = 0;
  pNVar3[1].dim.d[5] = 0;
  *(undefined8 *)(pNVar3[1].dim.d + 6) = 0;
  pNVar3[1].dim.bd = uVar1;
  *(float *)&pNVar3[1].field_0x44 = local_40;
  pNVar3[1].device = (Device *)0x0;
  __position._M_current =
       (this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_38 = pNVar3;
  if (__position._M_current ==
      (this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<dynet::Node*,std::allocator<dynet::Node*>>::_M_realloc_insert<dynet::Node*>
              ((vector<dynet::Node*,std::allocator<dynet::Node*>> *)this,__position,&local_38);
    ppNVar4 = (this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    *__position._M_current = pNVar3;
    ppNVar4 = (this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_finish + 1;
    (this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppNVar4;
  }
  if (ppNVar4[-1]->device == (Device *)0x0) {
    if (arguments->_M_len == 0) {
      ppDVar5 = (Device **)&dynet::default_device;
    }
    else {
      ppDVar5 = &(this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[*arguments->_M_array]->device;
    }
    ppNVar4[-1]->device = *ppDVar5;
  }
  set_dim_for_new_node(this,&local_3c);
  return local_3c;
}

Assistant:

inline VariableIndex ComputationGraph::add_function(const std::initializer_list<VariableIndex>& arguments,
    Args&&... side_information) {
  VariableIndex new_node_index(nodes.size());
  nodes.push_back(new Function(arguments, std::forward<Args>(side_information)...));
  if (nodes.back()->device == nullptr) {
    if (arguments.size()) {
      nodes.back()->device = nodes[*arguments.begin()]->device;
    } else {
      nodes.back()->device = dynet::default_device;
    }
  }
  set_dim_for_new_node(new_node_index);
  return new_node_index;
}